

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaConLaw.cpp
# Opt level: O3

void __thiscall NaControlLaw::Save(NaControlLaw *this)

{
  NaDataStream *in_RSI;
  
  Save((NaControlLaw *)&this[-1].lin_rand.LinChain.super_NaConfigPart.pSelfData,in_RSI);
  return;
}

Assistant:

void    NaControlLaw::Save (NaDataStream& ds)
{
    ds.PutComment("Control law definition (set point)");
    ds.PutF("Current source kind", "%s", SourceToStrIO(source));

    // clsDescription
    ds.PutComment("Source kind 'description': set point by description");
    ds.PutF("Number of items", "%u", items.count());
    ds.PutComment(" 1 - Law kind ('constant', 'meander', 'pike', 'sine',"
                  " 'sine_sine')");
    ds.PutComment(" 2 - Relative value");
    ds.PutComment(" 3 - Duration (how long lasts), s");
    ds.PutComment(" 4 - Period (for periodic laws, s");

    for(int i = 0; i < items.count(); ++i){
        items[i].Save(ds);
    }

    // clsFromFile
    ds.PutComment("Source kind 'from_file': set point from file");
    ds.PutF("File path", "%s", NULL==filepath? "empty": filepath);

    // clsManual
    ds.PutComment("Source kind 'manual': manual set point");
    ds.PutF("Start value", "%g", start_value);

    // clsRandom
    ds.PutComment("Source kind 'random': randomized set point");
    lin_rand.Save(ds);
}